

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfogatherer_p.h
# Opt level: O0

Type __thiscall QExtendedInformation::type(QExtendedInformation *this)

{
  ulong uVar1;
  Type local_4;
  
  uVar1 = QFileInfo::isDir();
  if ((uVar1 & 1) == 0) {
    uVar1 = QFileInfo::isFile();
    if ((uVar1 & 1) == 0) {
      uVar1 = QFileInfo::exists();
      if (((uVar1 & 1) == 0) && (uVar1 = QFileInfo::isSymLink(), (uVar1 & 1) != 0)) {
        local_4 = System;
      }
      else {
        local_4 = System;
      }
    }
    else {
      local_4 = File;
    }
  }
  else {
    local_4 = Dir;
  }
  return local_4;
}

Assistant:

Type type() const {
        if (mFileInfo.isDir()) {
            return QExtendedInformation::Dir;
        }
        if (mFileInfo.isFile()) {
            return QExtendedInformation::File;
        }
        if (!mFileInfo.exists() && mFileInfo.isSymLink()) {
            return QExtendedInformation::System;
        }
        return QExtendedInformation::System;
    }